

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

double Catch::Benchmark::Detail::weighted_average_quantile(int k,int q,double *first,double *last)

{
  long lVar1;
  double *pdVar2;
  ulong uVar3;
  double *pdVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  
  uVar3 = (long)last - (long)first >> 3;
  dVar6 = (double)(long)((long)k * (uVar3 - 1)) / (double)q;
  dVar7 = dVar6 - (double)(int)dVar6;
  pdVar5 = first + (int)dVar6;
  if ((last != first) && (pdVar5 != last)) {
    lVar1 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::__introselect<double*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (first,pdVar5,last,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
  }
  dVar6 = *pdVar5;
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    pdVar4 = pdVar5 + 1;
    pdVar5 = pdVar5 + 2;
    if (pdVar5 != last && pdVar4 != last) {
      do {
        pdVar2 = pdVar5;
        if (*pdVar4 < *pdVar5 || *pdVar4 == *pdVar5) {
          pdVar2 = pdVar4;
        }
        pdVar4 = pdVar2;
        pdVar5 = pdVar5 + 1;
      } while (pdVar5 != last);
    }
    dVar6 = dVar7 * (*pdVar4 - dVar6) + dVar6;
  }
  return dVar6;
}

Assistant:

double weighted_average_quantile( int k,
                                              int q,
                                              double* first,
                                              double* last ) {
                auto count = last - first;
                double idx = (count - 1) * k / static_cast<double>(q);
                int j = static_cast<int>(idx);
                double g = idx - j;
                std::nth_element(first, first + j, last);
                auto xj = first[j];
                if ( Catch::Detail::directCompare( g, 0 ) ) {
                    return xj;
                }

                auto xj1 = *std::min_element(first + (j + 1), last);
                return xj + g * (xj1 - xj);
            }